

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O0

uint * RDL_giveRCF(RDL_data *data,uint index,char mode)

{
  RDL_node *local_20;
  uint *result;
  char mode_local;
  uint index_local;
  RDL_data *data_local;
  
  if (mode == 'a') {
    local_20 = RDL_getNodesRCF(data,index);
  }
  else {
    if (mode != 'b') {
      (*RDL_outputFunc)(RDL_ERROR,"tried to call \'RDL_giveRCF()\' with invalid mode \'%c\'\n",
                        (ulong)(uint)(int)mode);
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RingDecomposerLib.c"
                    ,0x2c9,"unsigned int *RDL_giveRCF(const RDL_data *, unsigned int, char)");
    }
    local_20 = RDL_getEdgesRCF(data,index);
  }
  return local_20;
}

Assistant:

static unsigned *RDL_giveRCF(const RDL_data *data, unsigned index, char mode)
{
  unsigned *result;
  if(mode == 'a')
  {
    result = RDL_getNodesRCF(data, index);
  }
  else if(mode == 'b')
  {
    result = RDL_getEdgesRCF(data, index);
  }
  else
  {
    RDL_outputFunc(RDL_ERROR, "tried to call 'RDL_giveRCF()' with invalid mode '%c'\n", mode);
    /* cannot occur when using interface */
    assert(0);
    return NULL;
  }

  return result;
}